

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluDeriveDisjoint4
               (word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r,word *pTruth0,
               word *pTruth1)

{
  word wVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  word pCofs [6] [256];
  
  iVar4 = (int)g->nVars;
  if (iVar4 < 7) {
    uVar6 = nVars - iVar4;
    if ((int)uVar6 < 5) {
      iVar4 = If_CluCountCofs4(pF,nVars,iVar4,pCofs);
      if (iVar4 - 5U < 0xfffffffe) {
        puts("If_CluDeriveDisjoint4(): Error!!!");
      }
      bVar3 = (byte)(1 << ((byte)uVar6 & 0x1f));
      uVar5 = (pCofs[3][0] << (bVar3 & 0x3f) | pCofs[2][0]) <<
              ((byte)(1 << ((byte)uVar6 + 1 & 0x1f)) & 0x3f) |
              pCofs[1][0] << (bVar3 & 0x3f) | pCofs[0][0];
      *pF = uVar5;
      wVar1 = If_CluAdjust(uVar5,uVar6 + 2);
      *pF = wVar1;
      r->nVars = (char)(uVar6 + 2);
      r->nMyu = '\0';
      uVar2 = 0;
      uVar5 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar5 = uVar2;
      }
      for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        r->pVars[uVar2] = (char)P2V[uVar2];
      }
      r->pVars[(int)uVar6] = (char)nVars;
      r->pVars[(long)(int)uVar6 + 1] = (char)nVars + '\x01';
      wVar1 = If_CluAdjust(pCofs[4][0],(int)g->nVars);
      *pTruth0 = wVar1;
      wVar1 = If_CluAdjust(pCofs[5][0],(int)g->nVars);
      *pTruth1 = wVar1;
      return;
    }
  }
  __assert_fail("g->nVars <= 6 && nFSset <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x4be,
                "void If_CluDeriveDisjoint4(word *, int, int *, int *, If_Grp_t *, If_Grp_t *, word *, word *)"
               );
}

Assistant:

void If_CluDeriveDisjoint4( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r, word * pTruth0, word * pTruth1 )
{
    word pCofs[6][CLU_WRD_MAX/4];
    word Cof0, Cof1;
    int i, RetValue, nFSset = nVars - g->nVars;

    assert( g->nVars <= 6 && nFSset <= 4 );

    RetValue = If_CluCountCofs4( pF, nVars, g->nVars, pCofs );
    if ( RetValue != 3 && RetValue != 4 )
        printf( "If_CluDeriveDisjoint4(): Error!!!\n" );

    Cof0  = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    Cof1  = (pCofs[3][0] << (1 << nFSset)) | pCofs[2][0];
    pF[0] = (Cof1 << (1 << (nFSset+1))) | Cof0;
    pF[0] = If_CluAdjust( pF[0], nFSset + 2 );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = nVars+1;

    *pTruth0 = If_CluAdjust( pCofs[4][0], g->nVars );
    *pTruth1 = If_CluAdjust( pCofs[5][0], g->nVars );
}